

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_2)

{
  bool value;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  TimeInMillis local_28;
  
  value = UnitTest::Passed(unit_test);
  FormatBool_abi_cxx11_(&local_e8,this,value);
  std::operator+(&local_68,"event=TestIterationEnd&passed=",&local_e8);
  std::operator+(&local_88,&local_68,"&elapsed_time=");
  local_28 = unit_test->impl_->elapsed_time_;
  StreamableToString<long_long>(&local_48,&local_28);
  std::operator+(&local_a8,&local_88,&local_48);
  std::operator+(&local_c8,&local_a8,"ms");
  SendLn(this,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test, int /* iteration */) {
    SendLn("event=TestIterationEnd&passed=" +
           FormatBool(unit_test.Passed()) + "&elapsed_time=" +
           StreamableToString(unit_test.elapsed_time()) + "ms");
  }